

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

bool __thiscall Socket::getPeerName(Socket *this,uint32 *ip,uint16 *port)

{
  int iVar1;
  socklen_t len;
  sockaddr_in addr;
  socklen_t local_24;
  sockaddr local_20;
  
  local_24 = 0x10;
  iVar1 = getpeername(this->s,&local_20,&local_24);
  if (iVar1 == 0) {
    *ip = (uint)local_20.sa_data._2_4_ >> 0x18 | (local_20.sa_data._2_4_ & 0xff0000) >> 8 |
          (local_20.sa_data._2_4_ & 0xff00) << 8 | local_20.sa_data._2_4_ << 0x18;
    *port = local_20.sa_data._0_2_ << 8 | (ushort)local_20.sa_data._0_2_ >> 8;
  }
  return iVar1 == 0;
}

Assistant:

bool Socket::getPeerName(uint32& ip, uint16& port)
{
  sockaddr_in addr;
  socklen_t len = sizeof(addr);
  if(getpeername(s, (sockaddr*)&addr, &len) != 0)
    return false;
  ip = ntohl(addr.sin_addr.s_addr);
  port = ntohs(addr.sin_port);
  return true;
}